

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computePostequiExpVecs
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *preRowscale,
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               *preColscale,DataArray<int> *rowscaleExp,DataArray<int> *colscaleExp,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  long lVar3;
  DataArray<int> *pDVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  cpp_dec_float<200U,_int,_void> local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar7 = 0;
  pDVar4 = colscaleExp;
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_2b0,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preRowscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x0,SUB81(colscaleExp,0));
  maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_330,(soplex *)lp,
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)preColscale,
             (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)0x1,SUB81(pDVar4,0));
  if ((local_2b0.fpclass != cpp_dec_float_NaN) && (local_330.fpclass != cpp_dec_float_NaN)) {
    iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_2b0,&local_330);
    if (iVar1 < 0) {
      pnVar2 = epsilon;
      pnVar5 = &local_b0;
      for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pnVar5->m_backend).data._M_elems[0] = (pnVar2->m_backend).data._M_elems[0];
        pnVar2 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar2 + ((ulong)bVar7 * -2 + 1) * 4);
        pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = (epsilon->m_backend).exp;
      local_b0.m_backend.neg = (epsilon->m_backend).neg;
      local_b0.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_b0.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      computeEquiExpVec(&(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,preRowscale,colscaleExp,&local_b0);
      pnVar2 = &local_130;
      pnVar5 = epsilon;
      pnVar6 = pnVar2;
      for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
        pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = (epsilon->m_backend).exp;
      local_130.m_backend.neg = (epsilon->m_backend).neg;
      local_130.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_130.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      pDVar4 = rowscaleExp;
      rowscaleExp = colscaleExp;
      goto LAB_0059a707;
    }
  }
  pnVar2 = epsilon;
  pnVar5 = &local_1b0;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = (pnVar2->m_backend).data._M_elems[0];
    pnVar2 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar2 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (epsilon->m_backend).exp;
  local_1b0.m_backend.neg = (epsilon->m_backend).neg;
  local_1b0.m_backend.fpclass = (epsilon->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)lp,preColscale,rowscaleExp,&local_1b0);
  lp = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)&lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  pnVar2 = &local_230;
  pnVar5 = epsilon;
  pnVar6 = pnVar2;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = (epsilon->m_backend).exp;
  local_230.m_backend.neg = (epsilon->m_backend).neg;
  local_230.m_backend.fpclass = (epsilon->m_backend).fpclass;
  local_230.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
  pDVar4 = colscaleExp;
LAB_0059a707:
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)lp,rowscaleExp,pDVar4,pnVar2);
  return;
}

Assistant:

void SPxEquiliSC<R>::computePostequiExpVecs(const SPxLPBase<R>& lp,
      const std::vector<R>& preRowscale, const std::vector<R>& preColscale,
      DataArray<int>& rowscaleExp, DataArray<int>& colscaleExp, R epsilon)
{
   const R colratio = maxPrescaledRatio(lp, preRowscale, false);
   const R rowratio = maxPrescaledRatio(lp, preColscale, true);

   const bool colFirst = colratio < rowratio;

   // see SPxEquiliSC<R>::scale for reason behind this branch
   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), preRowscale, colscaleExp, epsilon);
      computeEquiExpVec(lp.rowSet(), colscaleExp, rowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), preColscale, rowscaleExp, epsilon);
      computeEquiExpVec(lp.colSet(), rowscaleExp, colscaleExp, epsilon);
   }
}